

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O2

void button_binding_ungrab(natwm_state *state,xcb_window_t window,button_binding *binding)

{
  toggle_modifiers *ptVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  ushort *puVar2;
  undefined8 uVar3;
  
  uVar3 = 0x1049bd;
  xcb_ungrab_button(state->xcb,binding->button,window,binding->modifiers,in_R8,in_R9,0x1049bd);
  ptVar1 = state->button_state->modifiers;
  if (ptVar1 != (toggle_modifiers *)0x0) {
    for (puVar2 = ptVar1->masks; *puVar2 != 0; puVar2 = puVar2 + 1) {
      xcb_ungrab_button(state->xcb,binding->button,window,*puVar2 | binding->modifiers,in_R8,in_R9,
                        uVar3);
    }
  }
  return;
}

Assistant:

void button_binding_ungrab(const struct natwm_state *state, xcb_window_t window,
                           const struct button_binding *binding)
{
        xcb_ungrab_button(state->xcb, binding->button, window, binding->modifiers);

        struct toggle_modifiers *modifiers = state->button_state->modifiers;

        if (modifiers == NULL) {
                return;
        }

        for (uint16_t *mask = modifiers->masks; *mask != XCB_NONE; ++mask) {
                xcb_ungrab_button(state->xcb, binding->button, window, binding->modifiers | *mask);
        }
}